

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O0

void group_cb(Fl_Widget *param_1,void *param_2)

{
  Fl_Type *pFVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  Fl_Type *this;
  undefined4 extraout_var_00;
  Fl_Type *__filename;
  bool bVar7;
  Fl_Type *nxt;
  Fl_Type *t;
  Fl_Group_Type *n;
  Fl_Widget_Type *q;
  Fl_Type *qq;
  void *param_1_local;
  Fl_Widget *param_0_local;
  
  q = (Fl_Widget_Type *)Fl_Type::current;
  while( true ) {
    bVar7 = false;
    if (q != (Fl_Widget_Type *)0x0) {
      iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])();
      bVar7 = true;
      if (iVar2 != 0) {
        iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x1e])();
        bVar7 = iVar2 != 0;
      }
    }
    if (!bVar7) break;
    q = (Fl_Widget_Type *)(q->super_Fl_Type).parent;
  }
  if ((q == (Fl_Widget_Type *)0x0) || ((q->super_Fl_Type).level < 1)) {
LAB_0018cbaf:
    fl_message("Please select widgets to group");
  }
  else {
    if ((q->super_Fl_Type).level == 1) {
      iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[5])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"widget_class");
      if (iVar2 == 0) goto LAB_0018cbaf;
    }
    force_parent = 1;
    this = Fl_Group_Type::make(&Fl_Group_type);
    Fl_Type::move_before(this,&q->super_Fl_Type);
    pFVar1 = this[1].prev;
    uVar3 = Fl_Widget::x(q->o);
    uVar4 = Fl_Widget::y(q->o);
    uVar5 = Fl_Widget::w(q->o);
    uVar6 = Fl_Widget::h(q->o);
    __filename = (Fl_Type *)(ulong)uVar3;
    (*pFVar1->_vptr_Fl_Type[4])(pFVar1,__filename,(ulong)uVar4,(ulong)uVar5,(ulong)uVar6);
    nxt = Fl_Type::first;
    while (nxt != (Fl_Type *)0x0) {
      if (((nxt->level == this->level) && (nxt != this)) && (nxt->selected != '\0')) {
        iVar2 = Fl_Type::remove(nxt,(char *)__filename);
        __filename = this;
        Fl_Type::add(nxt,this);
        nxt = (Fl_Type *)CONCAT44(extraout_var_00,iVar2);
      }
      else {
        nxt = nxt->next;
      }
    }
    fix_group_size(this);
  }
  return;
}

Assistant:

void group_cb(Fl_Widget *, void *) {
  // Find the current widget:
  Fl_Type *qq = Fl_Type::current;
  while (qq && (!qq->is_widget() || qq->is_menu_item())) qq = qq->parent;
  if (!qq || qq->level < 1 || (qq->level == 1 && !strcmp(qq->type_name(), "widget_class"))) {
    fl_message("Please select widgets to group");
    return;
  }
  Fl_Widget_Type* q = (Fl_Widget_Type*)qq;
  force_parent = 1;
  Fl_Group_Type *n = (Fl_Group_Type*)(Fl_Group_type.make());
  n->move_before(q);
  n->o->resize(q->o->x(),q->o->y(),q->o->w(),q->o->h());
  for (Fl_Type *t = Fl_Type::first; t;) {
    if (t->level != n->level || t == n || !t->selected) {
      t = t->next; continue;}
    Fl_Type *nxt = t->remove();
    t->add(n);
    t = nxt;
  }
  fix_group_size(n);
}